

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O3

void __thiscall
mp::internal::NLFileReader<fmt::File>::Open(NLFileReader<fmt::File> *this,CStringRef filename)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  File local_c;
  
  fmt::File::File(&local_c,filename,0);
  fmt::File::close(&this->file_,(int)filename.data_);
  (this->file_).fd_ = local_c.fd_;
  local_c.fd_ = -1;
  fmt::File::~File(&local_c);
  sVar3 = fmt::File::size(&this->file_);
  this->size_ = sVar3;
  iVar2 = fmt::getpagesize();
  uVar1 = this->size_;
  uVar5 = uVar1 % CONCAT44(extraout_var,iVar2);
  uVar4 = (CONCAT44(extraout_var,iVar2) + uVar1) - uVar5;
  if (uVar5 == 0) {
    uVar4 = uVar1;
  }
  this->rounded_size_ = uVar4;
  return;
}

Assistant:

void mp::internal::NLFileReader<File>::Open(fmt::CStringRef filename) {
  file_ = File(filename, fmt::File::RDONLY | fmt::File::BINARY);
  size_ = ConvertFileToMmapSize(file_.size(), filename);
  // Round size up to a multiple of page_size. The remainded of the last
  // partial page is zero-filled both on POSIX and Windows so the resulting
  // memory buffer is zero terminated.
  std::size_t page_size = fmt::getpagesize();
  std::size_t remainder = size_ % page_size;
  rounded_size_ = remainder != 0 ? (size_ + page_size - remainder) : size_;
}